

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O0

UniquePtr<SSL_SESSION> __thiscall
bssl::anon_unknown_0::CreateClientSession
          (anon_unknown_0 *this,SSL_CTX *client_ctx,SSL_CTX *server_ctx,ClientConfig *config)

{
  bool bVar1;
  pointer client_00;
  pointer server_00;
  unique_ptr<ssl_st,_bssl::internal::Deleter> local_38;
  UniquePtr<SSL> server;
  UniquePtr<SSL> client;
  ClientConfig *config_local;
  SSL_CTX *server_ctx_local;
  SSL_CTX *client_ctx_local;
  
  std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator=
            ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)
             &(anonymous_namespace)::g_last_session,(nullptr_t)0x0);
  SSL_CTX_sess_set_new_cb((SSL_CTX *)client_ctx,SaveLastSession);
  std::unique_ptr<ssl_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<ssl_st,bssl::internal::Deleter> *)&server);
  std::unique_ptr<ssl_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<ssl_st,bssl::internal::Deleter> *)&local_38);
  bVar1 = ConnectClientAndServer
                    (&server,(UniquePtr<SSL> *)&local_38,client_ctx,server_ctx,config,true);
  if (bVar1) {
    client_00 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get(&server);
    server_00 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get(&local_38);
    bVar1 = FlushNewSessionTickets(client_00,server_00);
    if (bVar1) {
      SSL_CTX_sess_set_new_cb((SSL_CTX *)client_ctx,(new_session_cb *)0x0);
      bVar1 = std::unique_ptr::operator_cast_to_bool
                        ((unique_ptr *)&(anonymous_namespace)::g_last_session);
      if (bVar1) {
        std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::unique_ptr
                  ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)this,
                   (unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)
                   &(anonymous_namespace)::g_last_session);
      }
      else {
        fprintf(_stderr,"Client did not receive a session.\n");
        std::unique_ptr<ssl_session_st,bssl::internal::Deleter>::
        unique_ptr<bssl::internal::Deleter,void>
                  ((unique_ptr<ssl_session_st,bssl::internal::Deleter> *)this,(nullptr_t)0x0);
      }
      goto LAB_001adf55;
    }
  }
  fprintf(_stderr,"Failed to connect client and server.\n");
  std::unique_ptr<ssl_session_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<ssl_session_st,bssl::internal::Deleter> *)this,(nullptr_t)0x0);
LAB_001adf55:
  std::unique_ptr<ssl_st,_bssl::internal::Deleter>::~unique_ptr(&local_38);
  std::unique_ptr<ssl_st,_bssl::internal::Deleter>::~unique_ptr(&server);
  return (__uniq_ptr_data<ssl_session_st,_bssl::internal::Deleter,_true,_true>)
         (__uniq_ptr_data<ssl_session_st,_bssl::internal::Deleter,_true,_true>)this;
}

Assistant:

static bssl::UniquePtr<SSL_SESSION> CreateClientSession(
    SSL_CTX *client_ctx, SSL_CTX *server_ctx,
    const ClientConfig &config = ClientConfig()) {
  g_last_session = nullptr;
  SSL_CTX_sess_set_new_cb(client_ctx, SaveLastSession);

  // Connect client and server to get a session.
  bssl::UniquePtr<SSL> client, server;
  if (!ConnectClientAndServer(&client, &server, client_ctx, server_ctx,
                              config) ||
      !FlushNewSessionTickets(client.get(), server.get())) {
    fprintf(stderr, "Failed to connect client and server.\n");
    return nullptr;
  }

  SSL_CTX_sess_set_new_cb(client_ctx, nullptr);

  if (!g_last_session) {
    fprintf(stderr, "Client did not receive a session.\n");
    return nullptr;
  }
  return std::move(g_last_session);
}